

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O2

bool __thiscall QSslConfiguration::operator==(QSslConfiguration *this,QSslConfiguration *other)

{
  QSslConfigurationPrivate *pQVar1;
  QSslConfigurationPrivate *pQVar2;
  bool bVar3;
  compare_eq_result_container<QList<QSslCertificate>,_QSslCertificate> cVar4;
  compare_eq_result_container<QList<QSslCipher>,_QSslCipher> cVar5;
  compare_eq_result_container<QList<QSslEllipticCurve>,_QSslEllipticCurve> cVar6;
  compare_eq_result_container<QList<QByteArray>,_QByteArray> cVar7;
  
  pQVar1 = (other->d).d.ptr;
  pQVar2 = (this->d).d.ptr;
  if (pQVar2 == pQVar1) {
    bVar3 = true;
  }
  else {
    bVar3 = QSslCertificate::operator==(&pQVar2->peerCertificate,&pQVar1->peerCertificate);
    if ((((bVar3) &&
         (cVar4 = QList<QSslCertificate>::operator==
                            (&((this->d).d.ptr)->peerCertificateChain,
                             &((other->d).d.ptr)->peerCertificateChain), cVar4)) &&
        (cVar4 = QList<QSslCertificate>::operator==
                           (&((this->d).d.ptr)->localCertificateChain,
                            &((other->d).d.ptr)->localCertificateChain), cVar4)) &&
       ((bVar3 = QSslKey::operator==(&((this->d).d.ptr)->privateKey,&((other->d).d.ptr)->privateKey)
        , bVar3 &&
        (bVar3 = QSslCipher::operator==
                           (&((this->d).d.ptr)->sessionCipher,&((other->d).d.ptr)->sessionCipher),
        bVar3)))) {
      pQVar1 = (this->d).d.ptr;
      pQVar2 = (other->d).d.ptr;
      if ((((pQVar1->sessionProtocol == pQVar2->sessionProtocol) &&
           ((bVar3 = ::operator==(&pQVar1->preSharedKeyIdentityHint,
                                  &pQVar2->preSharedKeyIdentityHint), bVar3 &&
            (cVar5 = QList<QSslCipher>::operator==
                               (&((this->d).d.ptr)->ciphers,&((other->d).d.ptr)->ciphers), cVar5))))
          && (cVar6 = QList<QSslEllipticCurve>::operator==
                                (&((this->d).d.ptr)->ellipticCurves,
                                 &((other->d).d.ptr)->ellipticCurves), cVar6)) &&
         (((bVar3 = QSslKey::operator==(&((this->d).d.ptr)->ephemeralServerKey,
                                        &((other->d).d.ptr)->ephemeralServerKey), bVar3 &&
           (bVar3 = QSslDiffieHellmanParameters::isEqual
                              (&((this->d).d.ptr)->dhParams,&((other->d).d.ptr)->dhParams), bVar3))
          && (cVar4 = QList<QSslCertificate>::operator==
                                (&((this->d).d.ptr)->caCertificates,
                                 &((other->d).d.ptr)->caCertificates), cVar4)))) {
        pQVar1 = (this->d).d.ptr;
        pQVar2 = (other->d).d.ptr;
        if (((pQVar1->protocol == pQVar2->protocol) &&
            (pQVar1->peerVerifyMode == pQVar2->peerVerifyMode)) &&
           ((pQVar1->peerVerifyDepth == pQVar2->peerVerifyDepth &&
            ((pQVar1->allowRootCertOnDemandLoading == pQVar2->allowRootCertOnDemandLoading &&
             (bVar3 = comparesEqual<QByteArray,_QVariant,_true>
                                (&pQVar1->backendConfig,&pQVar2->backendConfig), bVar3)))))) {
          pQVar1 = (this->d).d.ptr;
          pQVar2 = (other->d).d.ptr;
          if (((pQVar1->sslOptions).super_QFlagsStorageHelper<QSsl::SslOption,_4>.
               super_QFlagsStorage<QSsl::SslOption>.i ==
               (pQVar2->sslOptions).super_QFlagsStorageHelper<QSsl::SslOption,_4>.
               super_QFlagsStorage<QSsl::SslOption>.i) &&
             (bVar3 = ::operator==(&pQVar1->sslSession,&pQVar2->sslSession), bVar3)) {
            pQVar1 = (this->d).d.ptr;
            pQVar2 = (other->d).d.ptr;
            if (((pQVar1->sslSessionTicketLifeTimeHint == pQVar2->sslSessionTicketLifeTimeHint) &&
                (cVar7 = QList<QByteArray>::operator==
                                   (&pQVar1->nextAllowedProtocols,&pQVar2->nextAllowedProtocols),
                cVar7)) &&
               (bVar3 = ::operator==(&((this->d).d.ptr)->nextNegotiatedProtocol,
                                     &((other->d).d.ptr)->nextNegotiatedProtocol), bVar3)) {
              pQVar1 = (this->d).d.ptr;
              pQVar2 = (other->d).d.ptr;
              if (((pQVar1->nextProtocolNegotiationStatus == pQVar2->nextProtocolNegotiationStatus)
                  && (pQVar1->dtlsCookieEnabled == pQVar2->dtlsCookieEnabled)) &&
                 ((pQVar1->ocspStaplingEnabled == pQVar2->ocspStaplingEnabled &&
                  (pQVar1->reportFromCallback == pQVar2->reportFromCallback)))) {
                return pQVar1->missingCertIsFatal == pQVar2->missingCertIsFatal;
              }
            }
          }
        }
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool QSslConfiguration::operator==(const QSslConfiguration &other) const
{
    if (d == other.d)
        return true;
    return d->peerCertificate == other.d->peerCertificate &&
        d->peerCertificateChain == other.d->peerCertificateChain &&
        d->localCertificateChain == other.d->localCertificateChain &&
        d->privateKey == other.d->privateKey &&
        d->sessionCipher == other.d->sessionCipher &&
        d->sessionProtocol == other.d->sessionProtocol &&
        d->preSharedKeyIdentityHint == other.d->preSharedKeyIdentityHint &&
        d->ciphers == other.d->ciphers &&
        d->ellipticCurves == other.d->ellipticCurves &&
        d->ephemeralServerKey == other.d->ephemeralServerKey &&
        d->dhParams == other.d->dhParams &&
        d->caCertificates == other.d->caCertificates &&
        d->protocol == other.d->protocol &&
        d->peerVerifyMode == other.d->peerVerifyMode &&
        d->peerVerifyDepth == other.d->peerVerifyDepth &&
        d->allowRootCertOnDemandLoading == other.d->allowRootCertOnDemandLoading &&
        d->backendConfig == other.d->backendConfig &&
        d->sslOptions == other.d->sslOptions &&
        d->sslSession == other.d->sslSession &&
        d->sslSessionTicketLifeTimeHint == other.d->sslSessionTicketLifeTimeHint &&
        d->nextAllowedProtocols == other.d->nextAllowedProtocols &&
        d->nextNegotiatedProtocol == other.d->nextNegotiatedProtocol &&
        d->nextProtocolNegotiationStatus == other.d->nextProtocolNegotiationStatus &&
        d->dtlsCookieEnabled == other.d->dtlsCookieEnabled &&
        d->ocspStaplingEnabled == other.d->ocspStaplingEnabled &&
        d->reportFromCallback == other.d->reportFromCallback &&
        d->missingCertIsFatal == other.d->missingCertIsFatal;
}